

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_quantize_fp_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  int iVar1;
  tran_low_t *in_RCX;
  long in_RDX;
  int16_t *unaff_RBX;
  qm_val_t *unaff_RBP;
  tran_low_t *in_RSI;
  tran_low_t *in_RDI;
  tran_low_t *in_R8;
  uint16_t *in_R9;
  uint16_t *unaff_R12;
  int16_t *unaff_R13;
  int16_t *unaff_R14;
  qm_val_t *unaff_R15;
  int unaff_retaddr;
  undefined8 *in_stack_00000008;
  int *in_stack_00000010;
  qm_val_t *iqm_ptr;
  qm_val_t *qm_ptr;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  
  if ((*(int16_t **)(in_stack_00000010 + 2) == (int16_t *)0x0) ||
     (*(int16_t **)(in_stack_00000010 + 4) == (int16_t *)0x0)) {
    iVar1 = *in_stack_00000010;
    if (iVar1 == 0) {
      (*av1_quantize_fp)(in_RDI,(intptr_t)in_RSI,*(int16_t **)(in_RDX + 0x78),
                         *(int16_t **)(in_RDX + 0x58),*(int16_t **)(in_RDX + 0x50),
                         *(int16_t **)(in_RDX + 0x70),in_RCX,in_R8,*(int16_t **)(in_RDX + 0x80),
                         in_R9,(int16_t *)*in_stack_00000008,(int16_t *)in_stack_00000008[1]);
    }
    else if (iVar1 == 1) {
      (*av1_quantize_fp_32x32)
                (in_RDI,(intptr_t)in_RSI,*(int16_t **)(in_RDX + 0x78),*(int16_t **)(in_RDX + 0x58),
                 *(int16_t **)(in_RDX + 0x50),*(int16_t **)(in_RDX + 0x70),in_RCX,in_R8,
                 *(int16_t **)(in_RDX + 0x80),in_R9,(int16_t *)*in_stack_00000008,
                 (int16_t *)in_stack_00000008[1]);
    }
    else if (iVar1 == 2) {
      (*av1_quantize_fp_64x64)
                (in_RDI,(intptr_t)in_RSI,*(int16_t **)(in_RDX + 0x78),*(int16_t **)(in_RDX + 0x58),
                 *(int16_t **)(in_RDX + 0x50),*(int16_t **)(in_RDX + 0x70),in_RCX,in_R8,
                 *(int16_t **)(in_RDX + 0x80),in_R9,(int16_t *)*in_stack_00000008,
                 (int16_t *)in_stack_00000008[1]);
    }
  }
  else {
    quantize_fp_helper_c
              (in_RCX,(intptr_t)in_R8,(int16_t *)in_R9,*(int16_t **)(in_stack_00000010 + 2),
               *(int16_t **)(in_stack_00000010 + 4),
               (int16_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RSI,
               in_RDI,unaff_RBX,unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr);
  }
  return;
}

Assistant:

void av1_quantize_fp_facade(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                            const MACROBLOCK_PLANE *p, tran_low_t *qcoeff_ptr,
                            tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                            const SCAN_ORDER *sc, const QUANT_PARAM *qparam) {
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
  if (qm_ptr != NULL && iqm_ptr != NULL) {
    quantize_fp_helper_c(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                         p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                         dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                         sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
  } else {
    switch (qparam->log_scale) {
      case 0:
        av1_quantize_fp(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                        p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                        dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                        sc->iscan);
        break;
      case 1:
        av1_quantize_fp_32x32(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                              p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                              dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                              sc->iscan);
        break;
      case 2:
        av1_quantize_fp_64x64(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                              p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                              dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                              sc->iscan);
        break;
      default: assert(0);
    }
  }
}